

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUURI.cpp
# Opt level: O2

void COLLADABU::URI::parsePath(String *path,String *dir,String *baseName,String *extension)

{
  int iVar1;
  pcre *ppVar2;
  pcre *ppVar3;
  String tmpFile;
  int extMatches [30];
  int dirMatches [30];
  
  if (parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
      ::findDirCompiledPattern == '\0') {
    iVar1 = __cxa_guard_acquire(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                                 ::findDirCompiledPattern);
    if (iVar1 != 0) {
      PcreCompiledPattern::PcreCompiledPattern(&parsePath::findDirCompiledPattern,"(.*/)?(.*)?");
      __cxa_atexit(PcreCompiledPattern::~PcreCompiledPattern,&parsePath::findDirCompiledPattern,
                   &__dso_handle);
      __cxa_guard_release(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                           ::findDirCompiledPattern);
    }
  }
  ppVar2 = PcreCompiledPattern::getCompiledPattern(&parsePath::findDirCompiledPattern);
  if (parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
      ::findExtCompiledPattern == '\0') {
    iVar1 = __cxa_guard_acquire(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                                 ::findExtCompiledPattern);
    if (iVar1 != 0) {
      PcreCompiledPattern::PcreCompiledPattern
                (&parsePath::findExtCompiledPattern,"([^.]*)?(\\.(.*))?");
      __cxa_atexit(PcreCompiledPattern::~PcreCompiledPattern,&parsePath::findExtCompiledPattern,
                   &__dso_handle);
      __cxa_guard_release(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                           ::findExtCompiledPattern);
    }
  }
  ppVar3 = PcreCompiledPattern::getCompiledPattern(&parsePath::findExtCompiledPattern);
  tmpFile._M_dataplus._M_p = (pointer)&tmpFile.field_2;
  tmpFile._M_string_length = 0;
  tmpFile.field_2._M_local_buf[0] = '\0';
  dir->_M_string_length = 0;
  *(dir->_M_dataplus)._M_p = '\0';
  baseName->_M_string_length = 0;
  *(baseName->_M_dataplus)._M_p = '\0';
  extension->_M_string_length = 0;
  *(extension->_M_dataplus)._M_p = '\0';
  iVar1 = pcre_exec(ppVar2,0,(path->_M_dataplus)._M_p,(int)path->_M_string_length,0,0,dirMatches,
                    0x1e);
  if (-1 < iVar1) {
    setStringFromMatches(dir,path,dirMatches,1);
    setStringFromMatches(&tmpFile,path,dirMatches,2);
    iVar1 = pcre_exec(ppVar3,0,tmpFile._M_dataplus._M_p,tmpFile._M_string_length & 0xffffffff,0,0,
                      extMatches,0x1e);
    if (-1 < iVar1) {
      setStringFromMatches(baseName,&tmpFile,extMatches,1);
      setStringFromMatches(extension,&tmpFile,extMatches,3);
    }
  }
  std::__cxx11::string::~string((string *)&tmpFile);
  return;
}

Assistant:

void URI::parsePath(const String& path,
		/* out */ String& dir,
		/* out */ String& baseName,
		/* out */ String& extension) {
			// !!!steveT Currently, if we have a file name that begins with a '.', as in
			// ".emacs", that will be treated as having no base name with an extension
			// of ".emacs". We might want to change this behavior, so that the base name
			// is considered ".emacs" and the extension is empty. I think this is more
			// in line with what path parsers in other libraries/languages do, and it
			// more accurately reflects the intended structure of the file name.

			// The following implementation cannot handle paths like this:
			// /tmp/se.3/file

			// regular expression: "(.*/)?(.*)?"
			static const PcreCompiledPattern findDirCompiledPattern("(.*/)?(.*)?");

			pcre* findDir = findDirCompiledPattern.getCompiledPattern();


			// regular expression: "([^.]*)?(\.(.*))?"
			static const PcreCompiledPattern findExtCompiledPattern("([^.]*)?(\\.(.*))?");
			pcre* findExt = findExtCompiledPattern.getCompiledPattern();
			
			String tmpFile;
			dir.clear();
			baseName.clear();
			extension.clear();

			int dirMatches[regExpMatchesVectorLength];

			int  dirResult = pcre_exec(
										findDir,           /* the compiled pattern */
										0,                 /* no extra data - we didn't study the pattern */
										path.c_str(),      /* the subject string */
										(int)path.size(),  /* the length of the subject */
										0,                 /* start at offset 0 in the subject */
										0,                 /* default options */
										dirMatches,     /* output vector for substring information */
										regExpMatchesVectorLength); /* number of elements in the output vector */

			if ( dirResult >= 0 )
			{	
				setStringFromMatches(dir, path, dirMatches, 1);
				setStringFromMatches(tmpFile, path, dirMatches, 2);

				int extMatches[regExpMatchesVectorLength];

				int  extResult = pcre_exec(
											findExt,           /* the compiled pattern */
											0,                 /* no extra data - we didn't study the pattern */
											tmpFile.c_str(),      /* the subject string */
											(int)tmpFile.size(),  /* the length of the subject */
											0,                 /* start at offset 0 in the subject */
											0,                 /* default options */
											extMatches,     /* output vector for substring information */
											regExpMatchesVectorLength); /* number of elements in the output vector */

				
				if ( extResult >= 0 )
				{
					setStringFromMatches(baseName, tmpFile, extMatches, 1);
					setStringFromMatches(extension, tmpFile, extMatches, 3);
				}
			}
	}